

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 (*pauVar1) [32];
  long *plVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  uint uVar7;
  void *pvVar8;
  parasail_matrix_t *ppVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  __m256i c;
  __m256i c_00;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i vH;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i a_12;
  __m256i a_13;
  __m256i vH_03;
  __m256i vH_04;
  __m256i vH_05;
  __m256i vH_06;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i b_12;
  __m256i b_13;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  uint uVar20;
  int iVar21;
  parasail_result_t *ppVar22;
  __m256i *ptr;
  __m256i *palVar23;
  __m256i *b_14;
  __m256i *palVar24;
  __m256i *b_15;
  __m256i *palVar25;
  __m256i *b_16;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *b_17;
  __m256i *b_18;
  __m256i *b_19;
  int64_t *ptr_02;
  __m256i *palVar26;
  ulong uVar27;
  undefined8 uVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  longlong lVar34;
  char *pcVar35;
  int iVar36;
  int iVar37;
  undefined4 in_register_00000014;
  ulong uVar38;
  ulong uVar39;
  __m256i *palVar40;
  longlong lVar41;
  long lVar42;
  uint uVar43;
  long lVar44;
  ulong uVar45;
  char *__format;
  long lVar46;
  __m256i *ptr_03;
  ulong uVar47;
  __m256i *ptr_04;
  ulong uVar48;
  uint uVar49;
  int iVar50;
  int32_t d;
  int32_t iVar51;
  ulong size;
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar59 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [32];
  __m256i_64_t e;
  __m256i_64_t h;
  undefined1 in_stack_fffffffffffffae0 [12];
  undefined4 in_stack_fffffffffffffaec;
  int iVar72;
  long lVar73;
  undefined4 in_stack_fffffffffffffb08;
  long local_460;
  long lStack_458;
  long lStack_448;
  undefined1 local_440 [32];
  long local_3e0;
  long lStack_3d8;
  long lStack_3c8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  long local_220;
  long lStack_218;
  long lStack_210;
  long lStack_208;
  long local_200;
  long lStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  longlong local_a0 [4];
  ulong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar35 = "profile";
  }
  else {
    pvVar8 = (profile->profile64).score;
    if (pvVar8 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar35 = "profile->profile64.score";
    }
    else {
      ppVar9 = profile->matrix;
      if (ppVar9 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar35 = "profile->matrix";
      }
      else {
        uVar7 = profile->s1Len;
        if ((int)uVar7 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar35 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar35 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar35 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar35 = "open";
        }
        else {
          if (-1 < gap) {
            uVar20 = uVar7 - 1;
            size = (ulong)uVar7 + 3 >> 2;
            uVar12 = (ulong)uVar20 % size;
            uVar48 = CONCAT44(0,open);
            iVar50 = -open;
            iVar29 = ppVar9->min;
            pvVar10 = (profile->profile64).matches;
            pvVar11 = (profile->profile64).similar;
            uVar39 = 0x8000000000000000 - (long)iVar29;
            if (iVar29 != iVar50 && SBORROW4(iVar29,iVar50) == iVar29 + open < 0) {
              uVar39 = uVar48 | 0x8000000000000000;
            }
            iVar29 = ppVar9->max;
            ppVar22 = parasail_result_new_table3((uint)((ulong)uVar7 + 3) & 0x7ffffffc,s2Len);
            if (ppVar22 != (parasail_result_t *)0x0) {
              ppVar22->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar22->flag | 0x4830802;
              ptr = parasail_memalign___m256i(0x20,size);
              palVar23 = parasail_memalign___m256i(0x20,size);
              b_14 = parasail_memalign___m256i(0x20,size);
              palVar24 = parasail_memalign___m256i(0x20,size);
              b_15 = parasail_memalign___m256i(0x20,size);
              palVar25 = parasail_memalign___m256i(0x20,size);
              b_16 = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign___m256i(0x20,size);
              b_17 = parasail_memalign___m256i(0x20,size);
              b_18 = parasail_memalign___m256i(0x20,size);
              b_19 = parasail_memalign___m256i(0x20,size);
              uVar43 = s2Len + 1;
              ptr_02 = parasail_memalign_int64_t(0x20,(ulong)uVar43);
              auVar58._8_8_ = 0;
              auVar58._0_8_ = ptr;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = palVar23;
              auVar58 = vpunpcklqdq_avx(auVar58,auVar60);
              auVar52._8_8_ = 0;
              auVar52._0_8_ = b_14;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = palVar24;
              auVar60 = vpunpcklqdq_avx(auVar52,auVar56);
              auVar52 = ZEXT116(0) * auVar60 + ZEXT116(1) * auVar58;
              auVar56 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar60;
              auVar57._8_8_ = 0;
              auVar57._0_8_ = b_15;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = palVar25;
              auVar58 = vpunpcklqdq_avx(auVar57,auVar61);
              auVar62._8_8_ = 0;
              auVar62._0_8_ = b_16;
              auVar64._8_8_ = 0;
              auVar64._0_8_ = ptr_00;
              auVar60 = vpunpcklqdq_avx(auVar62,auVar64);
              auVar58 = ZEXT116(0) * auVar60 + ZEXT116(1) * auVar58;
              auVar60 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar60;
              auVar53._0_8_ = -(ulong)(auVar52._0_8_ == 0);
              auVar53._8_8_ = -(ulong)(auVar52._8_8_ == 0);
              auVar53._16_8_ = -(ulong)(auVar56._0_8_ == 0);
              auVar53._24_8_ = -(ulong)(auVar56._8_8_ == 0);
              auVar59._0_8_ = -(ulong)(auVar58._0_8_ == 0);
              auVar59._8_8_ = -(ulong)(auVar58._8_8_ == 0);
              auVar59._16_8_ = -(ulong)(auVar60._0_8_ == 0);
              auVar59._24_8_ = -(ulong)(auVar60._8_8_ == 0);
              auVar53 = vpackssdw_avx2(auVar53,auVar59);
              if (((((b_17 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) && b_18 != (__m256i *)0x0)
                   && b_19 != (__m256i *)0x0) && ptr_02 != (int64_t *)0x0) &&
                  ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar53 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar53 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar53 >> 0x7f,0) == '\0') &&
                     (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar53 >> 0xbf,0) == '\0') &&
                   (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar53[0x1f])) {
                iVar21 = s2Len - 1;
                iVar31 = -(int)(uVar20 / size);
                iVar36 = iVar31 + 3;
                uVar27 = CONCAT44(0,gap);
                auVar54._8_4_ = gap;
                auVar54._0_8_ = uVar27;
                auVar54._12_4_ = 0;
                auVar54._16_4_ = gap;
                auVar54._20_4_ = 0;
                auVar54._24_4_ = gap;
                auVar54._28_4_ = 0;
                lVar32 = uVar39 + 1;
                lVar44 = 0x7ffffffffffffffe - (long)iVar29;
                alVar3[1]._4_4_ = in_stack_fffffffffffffaec;
                alVar3._0_12_ = in_stack_fffffffffffffae0;
                alVar3[2] = (longlong)b_16;
                alVar3[3] = (longlong)ptr;
                lVar73 = lVar32;
                parasail_memset___m256i(b_14,alVar3,size);
                alVar4[1]._4_4_ = in_stack_fffffffffffffaec;
                alVar4._0_12_ = in_stack_fffffffffffffae0;
                alVar4[2] = (longlong)b_16;
                alVar4[3] = (longlong)ptr;
                parasail_memset___m256i(b_15,alVar4,size);
                alVar5[1]._4_4_ = in_stack_fffffffffffffaec;
                alVar5._0_12_ = in_stack_fffffffffffffae0;
                alVar5[2] = (longlong)b_16;
                alVar5[3] = (longlong)ptr;
                parasail_memset___m256i(b_16,alVar5,size);
                alVar6[1]._4_4_ = in_stack_fffffffffffffaec;
                alVar6._0_12_ = in_stack_fffffffffffffae0;
                alVar6[2] = (longlong)b_16;
                alVar6[3] = (longlong)ptr;
                parasail_memset___m256i(b_17,alVar6,size);
                c[1]._4_4_ = in_stack_fffffffffffffaec;
                c._0_12_ = in_stack_fffffffffffffae0;
                c[2] = (longlong)b_16;
                c[3] = (longlong)ptr;
                parasail_memset___m256i(b_18,c,size);
                c_00[1]._4_4_ = in_stack_fffffffffffffaec;
                c_00._0_12_ = in_stack_fffffffffffffae0;
                c_00[2] = (longlong)b_16;
                c_00[3] = (longlong)ptr;
                parasail_memset___m256i(b_19,c_00,size);
                uVar38 = (ulong)iVar50;
                uVar39 = uVar38;
                for (uVar33 = 0; uVar33 != size; uVar33 = uVar33 + 1) {
                  uVar45 = uVar39;
                  for (lVar46 = 0; lVar46 != 4; lVar46 = lVar46 + 1) {
                    uVar47 = uVar45;
                    if (s1_beg != 0) {
                      uVar47 = 0;
                    }
                    local_80[lVar46] = uVar47;
                    local_a0[lVar46] = uVar47 - uVar48;
                    uVar45 = uVar45 - size * uVar27;
                  }
                  palVar26 = ptr + uVar33;
                  (*palVar26)[0] = local_80[0];
                  (*palVar26)[1] = local_80[1];
                  (*palVar26)[2] = local_80[2];
                  (*palVar26)[3] = local_80[3];
                  palVar26 = ptr_01 + uVar33;
                  (*palVar26)[0] = local_a0[0];
                  (*palVar26)[1] = local_a0[1];
                  (*palVar26)[2] = local_a0[2];
                  (*palVar26)[3] = local_a0[3];
                  uVar39 = uVar39 - uVar27;
                }
                *ptr_02 = 0;
                for (uVar39 = 1; uVar43 != uVar39; uVar39 = uVar39 + 1) {
                  iVar29 = 0;
                  if (s2_beg == 0) {
                    iVar29 = iVar50;
                  }
                  ptr_02[uVar39] = (long)iVar29;
                  iVar50 = iVar50 - gap;
                }
                uVar43 = (uint)size;
                uVar30 = uVar43 - 1;
                uVar39 = (ulong)(uint)s2Len;
                uVar33 = 0;
                local_2a0._8_8_ = lVar32;
                local_2a0._0_8_ = lVar32;
                local_2a0._16_8_ = lVar32;
                local_2a0._24_8_ = lVar32;
                local_280._8_8_ = lVar32;
                local_280._0_8_ = lVar32;
                local_280._16_8_ = lVar32;
                local_280._24_8_ = lVar32;
                local_260._8_8_ = lVar32;
                local_260._0_8_ = lVar32;
                local_260._16_8_ = lVar32;
                local_260._24_8_ = lVar32;
                local_240._8_8_ = lVar32;
                local_240._0_8_ = lVar32;
                local_240._16_8_ = lVar32;
                local_240._24_8_ = lVar32;
                iVar29 = iVar21;
                local_220 = lVar32;
                lStack_218 = lVar32;
                lStack_210 = lVar32;
                lStack_208 = lVar32;
                local_200 = lVar44;
                lStack_1f8 = lVar44;
                lStack_1f0 = lVar44;
                lStack_1e8 = lVar44;
                do {
                  ptr_04 = palVar25;
                  ptr_03 = palVar24;
                  palVar26 = palVar23;
                  if (uVar33 == uVar39) {
                    uVar39 = 0;
                    if (s2_end == 0) {
                      lVar34 = 0;
                      lVar41 = 0;
                    }
                    else {
                      for (; (int)uVar39 < iVar36; uVar39 = (ulong)((int)uVar39 + 1)) {
                        auVar53 = vperm2f128_avx(local_2a0,local_2a0,8);
                        local_2a0 = vpalignr_avx2(local_2a0,auVar53,8);
                        auVar53 = vperm2i128_avx2(local_280,local_280,8);
                        local_280 = vpalignr_avx2(local_280,auVar53,8);
                        auVar53 = vperm2i128_avx2(local_260,local_260,8);
                        local_260 = vpalignr_avx2(local_260,auVar53,8);
                        auVar53 = vperm2i128_avx2(local_240,local_240,8);
                        local_240 = vpalignr_avx2(local_240,auVar53,8);
                      }
                      lVar73 = vpextrq_avx(local_2a0._16_16_,1);
                      uVar39 = vpextrq_avx(local_280._16_16_,1);
                      lVar34 = vpextrq_avx(local_260._16_16_,1);
                      lVar41 = vpextrq_avx(local_240._16_16_,1);
                    }
                    iVar37 = (int)lVar41;
                    iVar31 = (int)lVar34;
                    iVar50 = (int)uVar39;
                    uVar30 = uVar20;
                    if (s1_end != 0) {
                      uVar48 = 0;
                      while( true ) {
                        iVar37 = (int)lVar41;
                        iVar31 = (int)lVar34;
                        iVar50 = (int)uVar39;
                        if ((uVar43 & 0x1fffffff) << 2 == (uint)uVar48) break;
                        uVar49 = ((uint)uVar48 & 3) * uVar43 + ((uint)(uVar48 >> 2) & 0x3fffffff);
                        lVar46 = lVar73;
                        if ((int)uVar49 < (int)uVar7) {
                          lVar42 = (*ptr)[uVar48];
                          lVar46 = lVar42;
                          if ((lVar73 < lVar42) ||
                             (((lVar46 = lVar73, lVar42 == lVar73 && (iVar21 == iVar29)) &&
                              ((int)uVar49 < (int)uVar30)))) {
                            uVar39 = (*b_14)[uVar48];
                            lVar34 = (*b_15)[uVar48];
                            lVar41 = (*b_16)[uVar48];
                            iVar21 = iVar29;
                            uVar30 = uVar49;
                          }
                        }
                        uVar48 = uVar48 + 1;
                        lVar73 = lVar46;
                      }
                    }
                    iVar72 = (int)lVar73;
                    if (s2_end == 0 && s1_end == 0) {
                      alVar3 = ptr[uVar12];
                      alVar4 = b_14[uVar12];
                      alVar5 = b_15[uVar12];
                      alVar6 = b_16[uVar12];
                      for (iVar50 = 0; iVar50 < iVar36; iVar50 = iVar50 + 1) {
                        auVar53 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,
                                                  8);
                        alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar53,8);
                        auVar53 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,
                                                  8);
                        alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar53,8);
                        auVar53 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,
                                                  8);
                        alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar53,8);
                        auVar53 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,
                                                  8);
                        alVar6 = (__m256i)vpalignr_avx2((undefined1  [32])alVar6,auVar53,8);
                      }
                      uVar28 = vpextrq_avx(alVar3._16_16_,1);
                      iVar72 = (int)uVar28;
                      uVar28 = vpextrq_avx(alVar4._16_16_,1);
                      iVar50 = (int)uVar28;
                      uVar28 = vpextrq_avx(alVar5._16_16_,1);
                      iVar31 = (int)uVar28;
                      uVar28 = vpextrq_avx(alVar6._16_16_,1);
                      iVar37 = (int)uVar28;
                      uVar30 = uVar20;
                      iVar21 = iVar29;
                    }
                    auVar19._8_8_ = lVar32;
                    auVar19._0_8_ = lVar32;
                    auVar19._16_8_ = lVar32;
                    auVar19._24_8_ = lVar32;
                    auVar18._8_8_ = lStack_1f8;
                    auVar18._0_8_ = local_200;
                    auVar18._16_8_ = lStack_1f0;
                    auVar18._24_8_ = lStack_1e8;
                    auVar53 = vpcmpgtq_avx2(auVar19,auVar18);
                    auVar16._8_8_ = lStack_218;
                    auVar16._0_8_ = local_220;
                    auVar16._16_8_ = lStack_210;
                    auVar16._24_8_ = lStack_208;
                    auVar55._8_8_ = lVar44;
                    auVar55._0_8_ = lVar44;
                    auVar55._16_8_ = lVar44;
                    auVar55._24_8_ = lVar44;
                    auVar59 = vpcmpgtq_avx2(auVar16,auVar55);
                    auVar53 = vpor_avx2(auVar59,auVar53);
                    if ((((auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         SUB321(auVar53 >> 0x7f,0) != '\0') || SUB321(auVar53 >> 0xbf,0) != '\0') ||
                        auVar53[0x1f] < '\0') {
                      *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
                      iVar72 = 0;
                      iVar50 = 0;
                      iVar31 = 0;
                      iVar37 = 0;
                      iVar21 = 0;
                      uVar30 = 0;
                    }
                    ppVar22->score = iVar72;
                    ppVar22->end_query = uVar30;
                    ppVar22->end_ref = iVar21;
                    ((ppVar22->field_4).stats)->matches = iVar50;
                    ((ppVar22->field_4).stats)->similar = iVar31;
                    ((ppVar22->field_4).stats)->length = iVar37;
                    parasail_free(ptr_02);
                    parasail_free(b_19);
                    parasail_free(b_18);
                    parasail_free(b_17);
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(b_16);
                    parasail_free(ptr_04);
                    parasail_free(b_15);
                    parasail_free(ptr_03);
                    parasail_free(b_14);
                    parasail_free(palVar26);
                    parasail_free(ptr);
                    return ppVar22;
                  }
                  palVar23 = ptr + uVar30;
                  alVar3 = ptr[uVar30];
                  alVar4 = b_14[uVar30];
                  alVar5 = b_15[uVar30];
                  alVar6 = b_16[uVar30];
                  auVar58 = alVar3._0_16_;
                  auVar66._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar58;
                  auVar66._16_16_ = ZEXT116(0) * alVar3._16_16_ + ZEXT116(1) * auVar58;
                  auVar53 = vpalignr_avx2((undefined1  [32])alVar3,auVar66,8);
                  auVar59 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                  auVar59 = vpalignr_avx2((undefined1  [32])alVar4,auVar59,8);
                  auVar66 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                  auVar66 = vpalignr_avx2((undefined1  [32])alVar5,auVar66,8);
                  auVar17 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,8);
                  auVar17 = vpalignr_avx2((undefined1  [32])alVar6,auVar17,8);
                  auVar53 = vpblendd_avx2(auVar53,ZEXT832((ulong)ptr_02[uVar33]),3);
                  lVar46 = (long)(int)(ppVar9->mapper[(byte)s2[uVar33]] * uVar43) * 0x20;
                  auVar68 = ZEXT1664((undefined1  [16])0x0);
                  iVar51 = 0;
                  auVar71._8_8_ = lVar32;
                  auVar71._0_8_ = lVar32;
                  auVar71._16_8_ = lVar32;
                  auVar71._24_8_ = lVar32;
                  auVar70 = ZEXT1664((undefined1  [16])0x0);
                  auVar13._8_8_ = 1;
                  auVar13._0_8_ = 1;
                  auVar13._16_8_ = 1;
                  auVar13._24_8_ = 1;
                  palVar24 = ptr_03;
                  palVar40 = b_16;
                  for (lVar42 = 0; d = (int32_t)uVar33, size << 5 != lVar42; lVar42 = lVar42 + 0x20)
                  {
                    auVar14 = *(undefined1 (*) [32])((long)*ptr_01 + lVar42);
                    pauVar1 = (undefined1 (*) [32])((long)*b_17 + lVar42);
                    auVar16 = *pauVar1;
                    auVar63 = *pauVar1;
                    pauVar1 = (undefined1 (*) [32])((long)*b_18 + lVar42);
                    auVar18 = *pauVar1;
                    auVar65 = *pauVar1;
                    pauVar1 = (undefined1 (*) [32])((long)*b_19 + lVar42);
                    auVar19 = *pauVar1;
                    auVar15 = *pauVar1;
                    auVar53 = vpaddq_avx2(auVar53,*(undefined1 (*) [32])
                                                   ((long)pvVar8 + lVar42 + lVar46));
                    a[1]._4_4_ = iVar21;
                    a._0_12_ = in_stack_fffffffffffffae0;
                    a[2] = (longlong)palVar40;
                    a[3] = (longlong)ptr;
                    b[1]._0_4_ = in_stack_fffffffffffffb08;
                    b[0] = lVar73;
                    b[1]._4_4_ = iVar29;
                    b[2] = (longlong)b_15;
                    b[3]._0_4_ = s2Len;
                    b[3]._4_4_ = in_register_00000014;
                    auVar55 = auVar53;
                    _mm256_max_epi64_rpl(palVar24,a,b);
                    a_00[1]._4_4_ = iVar21;
                    a_00._0_12_ = in_stack_fffffffffffffae0;
                    a_00[2] = (longlong)palVar40;
                    a_00[3] = (longlong)ptr;
                    b_00[1]._0_4_ = in_stack_fffffffffffffb08;
                    b_00[0] = lVar73;
                    b_00[1]._4_4_ = iVar29;
                    b_00[2] = (longlong)b_15;
                    b_00[3]._0_4_ = s2Len;
                    b_00[3]._4_4_ = in_register_00000014;
                    _mm256_max_epi64_rpl(palVar24,a_00,b_00);
                    *(undefined1 (*) [32])((long)*palVar26 + lVar42) = auVar55;
                    local_460 = auVar53._0_8_;
                    auVar67._0_8_ = -(ulong)(auVar55._0_8_ == local_460);
                    lStack_458 = auVar53._8_8_;
                    auVar67._8_8_ = -(ulong)(auVar55._8_8_ == lStack_458);
                    auVar67._16_8_ = -(ulong)(auVar55._16_8_ == auVar53._16_8_);
                    lStack_448 = auVar53._24_8_;
                    auVar67._24_8_ = -(ulong)(auVar55._24_8_ == lStack_448);
                    local_3e0 = auVar71._0_8_;
                    auVar69._0_8_ = -(ulong)(auVar55._0_8_ == local_3e0);
                    lStack_3d8 = auVar71._8_8_;
                    auVar69._8_8_ = -(ulong)(auVar55._8_8_ == lStack_3d8);
                    auVar69._16_8_ = -(ulong)(auVar55._16_8_ == auVar71._16_8_);
                    lStack_3c8 = auVar71._24_8_;
                    auVar69._24_8_ = -(ulong)(auVar55._24_8_ == lStack_3c8);
                    auVar53 = vblendvpd_avx(auVar63,auVar68._0_32_,auVar69);
                    auVar59 = vpaddq_avx2(auVar59,*(undefined1 (*) [32])
                                                   ((long)pvVar10 + lVar42 + lVar46));
                    auVar53 = vblendvpd_avx(auVar53,auVar59,auVar67);
                    *(undefined1 (*) [32])((long)*ptr_03 + lVar42) = auVar53;
                    auVar59 = vblendvpd_avx(auVar65,auVar70._0_32_,auVar69);
                    auVar66 = vpaddq_avx2(auVar66,*(undefined1 (*) [32])
                                                   ((long)pvVar11 + lVar42 + lVar46));
                    auVar59 = vblendvpd_avx(auVar59,auVar66,auVar67);
                    *(undefined1 (*) [32])((long)*ptr_04 + lVar42) = auVar59;
                    auVar66 = vblendvpd_avx(auVar15,auVar13,auVar69);
                    auVar63 = vpcmpeqd_avx2(auVar15,auVar15);
                    auVar17 = vpsubq_avx2(auVar17,auVar63);
                    auVar66 = vblendvpd_avx(auVar66,auVar17,auVar67);
                    *(undefined1 (*) [32])((long)*ptr_00 + lVar42) = auVar66;
                    a_01[1]._4_4_ = iVar21;
                    a_01._0_12_ = in_stack_fffffffffffffae0;
                    a_01[2] = (longlong)palVar40;
                    a_01[3] = (longlong)ptr;
                    b_01[1]._0_4_ = in_stack_fffffffffffffb08;
                    b_01[0] = lVar73;
                    b_01[1]._4_4_ = iVar29;
                    b_01[2] = (longlong)b_15;
                    b_01[3]._0_4_ = s2Len;
                    b_01[3]._4_4_ = in_register_00000014;
                    _mm256_min_epi64_rpl(palVar24,a_01,b_01);
                    a_02[1]._4_4_ = iVar21;
                    a_02._0_12_ = in_stack_fffffffffffffae0;
                    a_02[2] = (longlong)palVar40;
                    a_02[3] = (longlong)ptr;
                    b_02[1]._0_4_ = in_stack_fffffffffffffb08;
                    b_02[0] = lVar73;
                    b_02[1]._4_4_ = iVar29;
                    b_02[2] = (longlong)b_15;
                    b_02[3]._0_4_ = s2Len;
                    b_02[3]._4_4_ = in_register_00000014;
                    _mm256_max_epi64_rpl(palVar24,a_02,b_02);
                    a_03[1]._4_4_ = iVar21;
                    a_03._0_12_ = in_stack_fffffffffffffae0;
                    a_03[2] = (longlong)palVar40;
                    a_03[3] = (longlong)ptr;
                    b_03[1]._0_4_ = in_stack_fffffffffffffb08;
                    b_03[0] = lVar73;
                    b_03[1]._4_4_ = iVar29;
                    b_03[2] = (longlong)b_15;
                    b_03[3]._0_4_ = s2Len;
                    b_03[3]._4_4_ = in_register_00000014;
                    _mm256_max_epi64_rpl(palVar24,a_03,b_03);
                    a_04[1]._4_4_ = iVar21;
                    a_04._0_12_ = in_stack_fffffffffffffae0;
                    a_04[2] = (longlong)palVar40;
                    a_04[3] = (longlong)ptr;
                    b_04[1]._0_4_ = in_stack_fffffffffffffb08;
                    b_04[0] = lVar73;
                    b_04[1]._4_4_ = iVar29;
                    b_04[2] = (longlong)b_15;
                    b_04[3]._0_4_ = s2Len;
                    b_04[3]._4_4_ = in_register_00000014;
                    _mm256_max_epi64_rpl(palVar24,a_04,b_04);
                    a_05[1]._4_4_ = iVar21;
                    a_05._0_12_ = in_stack_fffffffffffffae0;
                    a_05[2] = (longlong)palVar40;
                    a_05[3] = (longlong)ptr;
                    b_05[1]._0_4_ = in_stack_fffffffffffffb08;
                    b_05[0] = lVar73;
                    b_05[1]._4_4_ = iVar29;
                    b_05[2] = (longlong)b_15;
                    b_05[3]._0_4_ = s2Len;
                    b_05[3]._4_4_ = in_register_00000014;
                    _mm256_max_epi64_rpl(palVar24,a_05,b_05);
                    vH[1]._4_4_ = iVar21;
                    vH._0_12_ = in_stack_fffffffffffffae0;
                    vH[2] = (longlong)palVar40;
                    vH[3] = (longlong)ptr;
                    uVar49 = s2Len;
                    arr_store_si256(*(int **)((long)((ppVar22->field_4).trace)->trace_del_table + 8)
                                    ,vH,iVar51,uVar43,d,s2Len);
                    vH_00[1]._4_4_ = iVar21;
                    vH_00._0_12_ = in_stack_fffffffffffffae0;
                    vH_00[2] = (longlong)palVar40;
                    vH_00[3] = (longlong)ptr;
                    arr_store_si256(*(int **)((long)((ppVar22->field_4).trace)->trace_del_table +
                                             0x10),vH_00,iVar51,uVar43,d,s2Len);
                    vH_01[1]._4_4_ = iVar21;
                    vH_01._0_12_ = in_stack_fffffffffffffae0;
                    vH_01[2] = (longlong)palVar40;
                    vH_01[3] = (longlong)ptr;
                    arr_store_si256(*(int **)((long)((ppVar22->field_4).trace)->trace_del_table +
                                             0x18),vH_01,iVar51,uVar43,d,s2Len);
                    palVar24 = *((ppVar22->field_4).trace)->trace_del_table;
                    vH_02[1]._4_4_ = iVar21;
                    vH_02._0_12_ = in_stack_fffffffffffffae0;
                    vH_02[2] = (longlong)palVar40;
                    vH_02[3] = (longlong)ptr;
                    arr_store_si256((int *)palVar24,vH_02,iVar51,uVar43,d,s2Len);
                    auVar17._8_4_ = open;
                    auVar17._0_8_ = uVar48;
                    auVar17._12_4_ = 0;
                    auVar17._16_4_ = open;
                    auVar17._20_4_ = 0;
                    auVar17._24_4_ = open;
                    auVar17._28_4_ = 0;
                    auVar15 = vpsubq_avx2(auVar55,auVar17);
                    auVar17 = vpsubq_avx2(auVar14,auVar54);
                    a_06[1]._4_4_ = iVar21;
                    a_06._0_12_ = in_stack_fffffffffffffae0;
                    a_06[2] = (longlong)palVar40;
                    a_06[3] = (longlong)ptr;
                    b_06[1]._0_4_ = in_stack_fffffffffffffb08;
                    b_06[0] = lVar73;
                    b_06[1]._4_4_ = iVar29;
                    b_06[2] = (longlong)b_15;
                    b_06[3]._0_4_ = uVar49;
                    b_06[3]._4_4_ = in_register_00000014;
                    auVar55 = auVar15;
                    _mm256_max_epi64_rpl(palVar24,a_06,b_06);
                    auVar65 = vpcmpgtq_avx2(auVar15,auVar17);
                    auVar17 = vblendvpd_avx(auVar16,auVar53,auVar65);
                    auVar63 = vblendvpd_avx(auVar18,auVar59,auVar65);
                    auVar14 = vpcmpeqd_avx2(auVar69,auVar69);
                    auVar16 = vpsubq_avx2(auVar19,auVar14);
                    auVar14 = vpsubq_avx2(auVar66,auVar14);
                    auVar66 = vblendvpd_avx(auVar16,auVar14,auVar65);
                    *(undefined1 (*) [32])((long)*ptr_01 + lVar42) = auVar55;
                    *(undefined1 (*) [32])((long)*b_17 + lVar42) = auVar17;
                    *(undefined1 (*) [32])((long)*b_18 + lVar42) = auVar63;
                    *(undefined1 (*) [32])((long)*b_19 + lVar42) = auVar66;
                    auVar66 = vpsubq_avx2(auVar71,auVar54);
                    a_07[1]._4_4_ = iVar21;
                    a_07._0_12_ = in_stack_fffffffffffffae0;
                    a_07[2] = (longlong)palVar40;
                    a_07[3] = (longlong)ptr;
                    b_07[1]._0_4_ = in_stack_fffffffffffffb08;
                    b_07[0] = lVar73;
                    b_07[1]._4_4_ = iVar29;
                    b_07[2] = (longlong)b_15;
                    b_07[3]._0_4_ = uVar49;
                    b_07[3]._4_4_ = in_register_00000014;
                    auVar71 = auVar15;
                    _mm256_max_epi64_rpl(palVar24,a_07,b_07);
                    auVar66 = vpcmpgtq_avx2(auVar15,auVar66);
                    auVar53 = vblendvpd_avx(auVar68._0_32_,auVar53,auVar66);
                    auVar68 = ZEXT3264(auVar53);
                    auVar53 = vblendvpd_avx(auVar70._0_32_,auVar59,auVar66);
                    auVar70 = ZEXT3264(auVar53);
                    auVar53 = vpsubq_avx2(auVar13,_DAT_008a5a80);
                    auVar13 = vblendvpd_avx(auVar53,auVar14,auVar66);
                    auVar53 = *(undefined1 (*) [32])((long)*ptr + lVar42);
                    auVar59 = *(undefined1 (*) [32])((long)*b_14 + lVar42);
                    auVar66 = *(undefined1 (*) [32])((long)*b_15 + lVar42);
                    auVar17 = *(undefined1 (*) [32])((long)*palVar40 + lVar42);
                    iVar51 = iVar51 + 1;
                    s2Len = uVar49;
                  }
                  for (iVar50 = 0; iVar50 != 4; iVar50 = iVar50 + 1) {
                    uVar27 = uVar38;
                    if (s2_beg == 0) {
                      uVar27 = ptr_02[uVar33 + 1] - uVar48;
                    }
                    auVar17 = vpermq_avx2((undefined1  [32])*palVar23,0x90);
                    auVar71 = vpermq_avx2(auVar71,0x90);
                    auVar59 = auVar68._0_32_;
                    auVar53 = vperm2i128_avx2(auVar59,auVar59,8);
                    auVar59 = vpalignr_avx2(auVar59,auVar53,8);
                    auVar66 = auVar70._0_32_;
                    auVar53 = vperm2i128_avx2(auVar66,auVar66,8);
                    auVar66 = vpalignr_avx2(auVar66,auVar53,8);
                    auVar13 = vpermq_avx2(auVar13,0x90);
                    auVar53 = vpblendd_avx2(auVar17,ZEXT832((ulong)ptr_02[uVar33]),3);
                    auVar71 = vpblendd_avx2(auVar71,ZEXT832(uVar27),3);
                    auVar13 = vpblendd_avx2(auVar13,ZEXT832(1),3);
                    lVar42 = 0;
                    uVar27 = 0;
                    uVar49 = s2Len;
                    while( true ) {
                      auVar70 = ZEXT3264(auVar66);
                      auVar68 = ZEXT3264(auVar59);
                      if (size == uVar27) break;
                      auVar53 = vpaddq_avx2(auVar53,*(undefined1 (*) [32])
                                                     ((long)pvVar8 + lVar42 + lVar46));
                      plVar2 = (long *)((long)*palVar26 + lVar42);
                      local_440._0_8_ = *plVar2;
                      local_440._8_8_ = plVar2[1];
                      local_440._16_8_ = plVar2[2];
                      local_440._24_8_ = plVar2[3];
                      a_08[1]._4_4_ = iVar21;
                      a_08._0_12_ = in_stack_fffffffffffffae0;
                      a_08[2] = (longlong)palVar40;
                      a_08[3] = (longlong)ptr;
                      b_08[1]._0_4_ = in_stack_fffffffffffffb08;
                      b_08[0] = lVar73;
                      b_08[1]._4_4_ = iVar29;
                      b_08[2] = (longlong)b_15;
                      b_08[3]._0_4_ = uVar49;
                      b_08[3]._4_4_ = in_register_00000014;
                      _mm256_max_epi64_rpl(palVar24,a_08,b_08);
                      plVar2 = (long *)((long)*palVar26 + lVar42);
                      *plVar2 = local_440._0_8_;
                      plVar2[1] = local_440._8_8_;
                      plVar2[2] = local_440._16_8_;
                      plVar2[3] = local_440._24_8_;
                      local_3e0 = auVar71._0_8_;
                      auVar63._0_8_ = -(ulong)(local_440._0_8_ == local_3e0);
                      lStack_3d8 = auVar71._8_8_;
                      auVar63._8_8_ = -(ulong)(local_440._8_8_ == lStack_3d8);
                      auVar63._16_8_ = -(ulong)(local_440._16_8_ == auVar71._16_8_);
                      lStack_3c8 = auVar71._24_8_;
                      auVar63._24_8_ = -(ulong)(local_440._24_8_ == lStack_3c8);
                      local_460 = auVar53._0_8_;
                      auVar65._0_8_ = -(ulong)(local_440._0_8_ == local_460);
                      lStack_458 = auVar53._8_8_;
                      auVar65._8_8_ = -(ulong)(local_440._8_8_ == lStack_458);
                      auVar65._16_8_ = -(ulong)(local_440._16_8_ == auVar53._16_8_);
                      lStack_448 = auVar53._24_8_;
                      auVar65._24_8_ = -(ulong)(local_440._24_8_ == lStack_448);
                      auVar63 = vpandn_avx2(auVar65,auVar63);
                      auVar53 = vblendvpd_avx(*(undefined1 (*) [32])((long)*ptr_03 + lVar42),auVar59
                                              ,auVar63);
                      *(undefined1 (*) [32])((long)*ptr_03 + lVar42) = auVar53;
                      auVar17 = vblendvpd_avx(*(undefined1 (*) [32])((long)*ptr_04 + lVar42),auVar66
                                              ,auVar63);
                      *(undefined1 (*) [32])((long)*ptr_04 + lVar42) = auVar17;
                      auVar63 = vblendvpd_avx(*(undefined1 (*) [32])((long)*ptr_00 + lVar42),auVar13
                                              ,auVar63);
                      *(undefined1 (*) [32])((long)*ptr_00 + lVar42) = auVar63;
                      a_09[1]._4_4_ = iVar21;
                      a_09._0_12_ = in_stack_fffffffffffffae0;
                      a_09[2] = (longlong)palVar40;
                      a_09[3] = (longlong)ptr;
                      b_09[1]._0_4_ = in_stack_fffffffffffffb08;
                      b_09[0] = lVar73;
                      b_09[1]._4_4_ = iVar29;
                      b_09[2] = (longlong)b_15;
                      b_09[3]._0_4_ = uVar49;
                      b_09[3]._4_4_ = in_register_00000014;
                      _mm256_min_epi64_rpl(palVar24,a_09,b_09);
                      a_10[1]._4_4_ = iVar21;
                      a_10._0_12_ = in_stack_fffffffffffffae0;
                      a_10[2] = (longlong)palVar40;
                      a_10[3] = (longlong)ptr;
                      b_10[1]._0_4_ = in_stack_fffffffffffffb08;
                      b_10[0] = lVar73;
                      b_10[1]._4_4_ = iVar29;
                      b_10[2] = (longlong)b_15;
                      b_10[3]._0_4_ = uVar49;
                      b_10[3]._4_4_ = in_register_00000014;
                      _mm256_max_epi64_rpl(palVar24,a_10,b_10);
                      a_11[1]._4_4_ = iVar21;
                      a_11._0_12_ = in_stack_fffffffffffffae0;
                      a_11[2] = (longlong)palVar40;
                      a_11[3] = (longlong)ptr;
                      b_11[1]._0_4_ = in_stack_fffffffffffffb08;
                      b_11[0] = lVar73;
                      b_11[1]._4_4_ = iVar29;
                      b_11[2] = (longlong)b_15;
                      b_11[3]._0_4_ = uVar49;
                      b_11[3]._4_4_ = in_register_00000014;
                      _mm256_max_epi64_rpl(palVar24,a_11,b_11);
                      a_12[1]._4_4_ = iVar21;
                      a_12._0_12_ = in_stack_fffffffffffffae0;
                      a_12[2] = (longlong)palVar40;
                      a_12[3] = (longlong)ptr;
                      b_12[1]._0_4_ = in_stack_fffffffffffffb08;
                      b_12[0] = lVar73;
                      b_12[1]._4_4_ = iVar29;
                      b_12[2] = (longlong)b_15;
                      b_12[3]._0_4_ = uVar49;
                      b_12[3]._4_4_ = in_register_00000014;
                      _mm256_max_epi64_rpl(palVar24,a_12,b_12);
                      a_13[1]._4_4_ = iVar21;
                      a_13._0_12_ = in_stack_fffffffffffffae0;
                      a_13[2] = (longlong)palVar40;
                      a_13[3] = (longlong)ptr;
                      b_13[1]._0_4_ = in_stack_fffffffffffffb08;
                      b_13[0] = lVar73;
                      b_13[1]._4_4_ = iVar29;
                      b_13[2] = (longlong)b_15;
                      b_13[3]._0_4_ = uVar49;
                      b_13[3]._4_4_ = in_register_00000014;
                      auVar65 = auVar63;
                      _mm256_max_epi64_rpl(palVar24,a_13,b_13);
                      vH_03[1]._4_4_ = iVar21;
                      vH_03._0_12_ = in_stack_fffffffffffffae0;
                      vH_03[2] = (longlong)palVar40;
                      vH_03[3] = (longlong)ptr;
                      iVar51 = (int32_t)uVar27;
                      s2Len = uVar49;
                      arr_store_si256(*(int **)((long)((ppVar22->field_4).trace)->trace_del_table +
                                               8),vH_03,iVar51,uVar43,d,uVar49);
                      vH_04[1]._4_4_ = iVar21;
                      vH_04._0_12_ = in_stack_fffffffffffffae0;
                      vH_04[2] = (longlong)palVar40;
                      vH_04[3] = (longlong)ptr;
                      arr_store_si256(*(int **)((long)((ppVar22->field_4).trace)->trace_del_table +
                                               0x10),vH_04,iVar51,uVar43,d,uVar49);
                      vH_05[1]._4_4_ = iVar21;
                      vH_05._0_12_ = in_stack_fffffffffffffae0;
                      vH_05[2] = (longlong)palVar40;
                      vH_05[3] = (longlong)ptr;
                      arr_store_si256(*(int **)((long)((ppVar22->field_4).trace)->trace_del_table +
                                               0x18),vH_05,iVar51,uVar43,d,uVar49);
                      palVar24 = *((ppVar22->field_4).trace)->trace_del_table;
                      vH_06[1]._4_4_ = iVar21;
                      vH_06._0_12_ = in_stack_fffffffffffffae0;
                      vH_06[2] = (longlong)palVar40;
                      vH_06[3] = (longlong)ptr;
                      arr_store_si256((int *)palVar24,vH_06,iVar51,uVar43,d,uVar49);
                      auVar14._8_4_ = open;
                      auVar14._0_8_ = uVar48;
                      auVar14._12_4_ = 0;
                      auVar14._16_4_ = open;
                      auVar14._20_4_ = 0;
                      auVar14._24_4_ = open;
                      auVar14._28_4_ = 0;
                      auVar14 = vpsubq_avx2(local_440,auVar14);
                      auVar71 = vpsubq_avx2(auVar71,auVar54);
                      auVar15 = vpcmpgtq_avx2(auVar14,auVar71);
                      auVar65 = vpcmpeqd_avx2(auVar65,auVar65);
                      auVar14 = auVar65 & ~auVar15;
                      if ((((auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           SUB321(auVar14 >> 0x7f,0) == '\0') && SUB321(auVar14 >> 0xbf,0) == '\0')
                          && -1 < auVar14[0x1f]) goto LAB_00794422;
                      auVar59 = vblendvpd_avx(auVar59,auVar53,auVar15);
                      auVar66 = vblendvpd_avx(auVar66,auVar17,auVar15);
                      auVar53 = vblendvpd_avx(auVar13,auVar63,auVar15);
                      auVar13 = vpsubq_avx2(auVar53,auVar65);
                      auVar53 = *(undefined1 (*) [32])((long)*ptr + lVar42);
                      uVar27 = uVar27 + 1;
                      lVar42 = lVar42 + 0x20;
                      uVar49 = s2Len;
                    }
                    s2Len = uVar49;
                  }
LAB_00794422:
                  auVar53 = vpcmpgtq_avx2((undefined1  [32])palVar26[uVar12],local_2a0);
                  local_2a0 = vblendvpd_avx(local_2a0,(undefined1  [32])palVar26[uVar12],auVar53);
                  local_280 = vblendvpd_avx(local_280,(undefined1  [32])ptr_03[uVar12],auVar53);
                  local_260 = vblendvpd_avx(local_260,(undefined1  [32])ptr_04[uVar12],auVar53);
                  local_240 = vblendvpd_avx(local_240,(undefined1  [32])ptr_00[uVar12],auVar53);
                  auVar15._8_8_ = -(ulong)(iVar36 == 2);
                  auVar15._0_8_ = -(ulong)(iVar36 == 3);
                  auVar15._16_8_ = -(ulong)(iVar36 == 1);
                  auVar15._24_8_ = -(ulong)(iVar31 == -3);
                  auVar15 = auVar15 & auVar53;
                  if ((((auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar15 >> 0x7f,0) != '\0') || SUB321(auVar15 >> 0xbf,0) != '\0') ||
                      auVar15[0x1f] < '\0') {
                    iVar21 = d;
                  }
                  uVar33 = uVar33 + 1;
                  palVar23 = ptr;
                  b_16 = ptr_00;
                  palVar24 = b_14;
                  palVar25 = b_15;
                  ptr_00 = palVar40;
                  b_14 = ptr_03;
                  ptr = palVar26;
                  b_15 = ptr_04;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar35 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_stats_table_striped_profile_avx2_256_64",pcVar35);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHM;
    __m256i vMaxHS;
    __m256i vMaxHL;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m256i*)profile->profile64.score;
    vProfileM = (__m256i*)profile->profile64.matches;
    vProfileS = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    boundary  = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);
        vHM = _mm256_slli_si256_rpl(vHM, 8);
        vHS = _mm256_slli_si256_rpl(vHS, 8);
        vHL = _mm256_slli_si256_rpl(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi64_rpl(vH_dag, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);

            case1 = _mm256_cmpeq_epi64(vH, vH_dag);
            case2 = _mm256_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vHM, _mm256_load_si256(vPM + i)),
                    case1);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vHS, _mm256_load_si256(vPS + i)),
                    case1);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm256_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vEL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vFL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm256_slli_si256_rpl(vHp, 8);
            vF = _mm256_slli_si256_rpl(vF, 8);
            vFM = _mm256_slli_si256_rpl(vFM, 8);
            vFS = _mm256_slli_si256_rpl(vFS, 8);
            vFL = _mm256_slli_si256_rpl(vFL, 8);
            vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm256_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi64(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi64(vH, vHp);
                case2 = _mm256_cmpeq_epi64(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi64(vH, vGapO);
                vF_ext = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi64(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi64(vFL, vOne),
                        _mm256_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            cond_max = _mm256_cmpgt_epi64(vH, vMaxH);
            vMaxH = _mm256_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm256_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm256_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm256_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
            vMaxHM = _mm256_slli_si256_rpl(vMaxHM, 8);
            vMaxHS = _mm256_slli_si256_rpl(vMaxHS, 8);
            vMaxHL = _mm256_slli_si256_rpl(vMaxHL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl(vMaxHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl(vMaxHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int64_t *m = (int64_t*)pvHMStore;
        int64_t *s = (int64_t*)pvHSStore;
        int64_t *l = (int64_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        __m256i vHM = _mm256_load_si256(pvHMStore + offset);
        __m256i vHS = _mm256_load_si256(pvHSStore + offset);
        __m256i vHL = _mm256_load_si256(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}